

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O1

void CoreML::Specification::protobuf_LinkedModel_2eproto::TableStruct::Shutdown(void)

{
  if (DAT_0074a5c0 == '\x01') {
    DAT_0074a5c0 = '\0';
    (*(code *)*_LinkedModel_default_instance_)();
  }
  if (DAT_0074a5f8 == '\x01') {
    DAT_0074a5f8 = 0;
    (*(code *)*_LinkedModelFile_default_instance_)();
    return;
  }
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _LinkedModel_default_instance_.Shutdown();
  _LinkedModelFile_default_instance_.Shutdown();
}